

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::testSimpleScaleTo(Test *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  AutoTableElement *pAVar4;
  reference pQVar5;
  QLatin1String latin1;
  QArrayDataPointer<QRect> local_80;
  Report report;
  QArrayDataPointer<QRect> local_48;
  QArrayDataPointer<char16_t> local_28;
  
  if (fontFound) {
    fillModel(this,4,8,false);
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)&report);
    latin1.m_data = "Noto Sans";
    latin1.m_size = 9;
    QString::QString((QString *)&local_80,latin1);
    QFont::QFont((QFont *)&local_48,(QString *)&local_80,0xe,-1,false);
    KDReports::Report::setDefaultFont((QFont *)&report);
    QFont::~QFont((QFont *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_80);
    pAVar4 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::AutoTableElement::AutoTableElement
              ((AutoTableElement *)&local_80,(QAbstractItemModel *)&this->m_model);
    KDReports::MainTable::setAutoTableElement(pAVar4);
    KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_80);
    KDReports::Report::scaleTo((int)&report,1);
    iVar3 = KDReports::Report::numberOfPages();
    cVar1 = QTest::qCompare(iVar3,1,"report.numberOfPages()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0xcc);
    if (cVar1 != '\0') {
      KDReports::Report::mainTable();
      local_80.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
      local_48.d = (Data *)0x3ff0000000000000;
      cVar1 = QTest::qCompare((double *)&local_80,(double *)&local_48,
                              "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0xcd);
      if (cVar1 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        local_48.size = 0;
        local_48.d = (Data *)0x0;
        local_48.ptr = (QRect *)0x0;
        local_28.d = (Data *)0x0;
        local_28.ptr = (char16_t *)0x700000003;
        QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_48,(QRect *)&local_28);
        bVar2 = QTest::qCompare<QRect>
                          ((QList<QRect> *)&local_80,(QList<QRect> *)&local_48,
                           "report.mainTable()->pageRects()","QList<QRect>() << QRect(0, 0, 4, 8)",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0xce);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_48);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_80);
        if (bVar2) {
          KDReports::Report::scaleTo((int)&report,4);
          iVar3 = KDReports::Report::numberOfPages();
          cVar1 = QTest::qCompare(iVar3,4,"report.numberOfPages()","4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                  ,0xd0);
          if (cVar1 != '\0') {
            KDReports::Report::mainTable();
            local_80.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
            local_48.d = (Data *)0x3ff0000000000000;
            cVar1 = QTest::qCompare((double *)&local_80,(double *)&local_48,
                                    "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                    ,0xd1);
            if (cVar1 != '\0') {
              KDReports::Report::mainTable();
              KDReports::MainTable::pageRects();
              pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_80,0);
              local_48.d = (Data *)0x0;
              local_48.ptr = (QRect *)0x700000000;
              bVar2 = QTest::qCompare<QRect,QRect>
                                (pQVar5,(QRect *)&local_48,"report.mainTable()->pageRects()[0]",
                                 "QRect(0, 0, 1, 8)",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0xd2);
              QArrayDataPointer<QRect>::~QArrayDataPointer(&local_80);
              if (bVar2) {
                KDReports::Report::mainTable();
                KDReports::MainTable::pageRects();
                pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_80,1);
                local_48.d = (Data *)0x1;
                local_48.ptr = (QRect *)0x700000001;
                bVar2 = QTest::qCompare<QRect,QRect>
                                  (pQVar5,(QRect *)&local_48,"report.mainTable()->pageRects()[1]",
                                   "QRect(1, 0, 1, 8)",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0xd3);
                QArrayDataPointer<QRect>::~QArrayDataPointer(&local_80);
                if (bVar2) {
                  KDReports::Report::mainTable();
                  KDReports::MainTable::pageRects();
                  pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_80,2);
                  local_48.d = (Data *)0x2;
                  local_48.ptr = (QRect *)0x700000002;
                  bVar2 = QTest::qCompare<QRect,QRect>
                                    (pQVar5,(QRect *)&local_48,"report.mainTable()->pageRects()[2]",
                                     "QRect(2, 0, 1, 8)",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0xd4);
                  QArrayDataPointer<QRect>::~QArrayDataPointer(&local_80);
                  if (bVar2) {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar5 = QList<QRect>::operator[]((QList<QRect> *)&local_80,3);
                    local_48.d = (Data *)0x3;
                    local_48.ptr = (QRect *)0x700000003;
                    QTest::qCompare<QRect,QRect>
                              (pQVar5,(QRect *)&local_48,"report.mainTable()->pageRects()[3]",
                               "QRect(3, 0, 1, 8)",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0xd5);
                    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_80);
                  }
                }
              }
            }
          }
        }
      }
    }
    KDReports::Report::~Report(&report);
  }
  else {
    QString::QString((QString *)&local_48,"Font %1 not found");
    QString::QString((QString *)&local_28,"Noto Sans");
    QString::arg((QString *)&report,(int)&local_48,(QChar)(char16_t)&local_28);
    QString::toLatin1_helper_inplace((QString *)&local_80);
    if (local_80.ptr == (QRect *)0x0) {
      local_80.ptr = (QRect *)&QByteArray::_empty;
    }
    QTest::qSkip((char *)local_80.ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0xc4);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  return;
}

Assistant:

void testSimpleScaleTo()
    {
        SKIP_IF_FONT_NOT_FOUND

        fillModel(4, 8);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 14));
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(1, 4);
        QCOMPARE(report.numberOfPages(), 1); // it fits
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, 4, 8));
        report.scaleTo(4, 1);
        QCOMPARE(report.numberOfPages(), 4); // one column per page
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(1, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[2], QRect(2, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[3], QRect(3, 0, 1, 8));
    }